

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind_def.cpp
# Opt level: O1

OmegaSN * slopeSN(vector<double,_std::allocator<double>_> *data,
                 vector<double,_std::allocator<double>_> *states,uint nbSegments,string *constraint)

{
  double *pdVar1;
  int iVar2;
  OmegaSN *this;
  
  this = (OmegaSN *)operator_new(0x70);
  pdVar1 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  OmegaSN::OmegaSN(this,states,*pdVar1,nbSegments,
                   (uint)((ulong)((long)(data->super__Vector_base<double,_std::allocator<double>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1) >>
                         3));
  iVar2 = std::__cxx11::string::compare((char *)constraint);
  if (iVar2 == 0) {
    OmegaSN::algoNULL(this,data);
  }
  iVar2 = std::__cxx11::string::compare((char *)constraint);
  if (iVar2 == 0) {
    OmegaSN::algoISOTONIC(this,data);
  }
  OmegaSN::backtracking
            (this,(uint)((ulong)((long)(data->super__Vector_base<double,_std::allocator<double>_>).
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(data->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data._M_start) >> 3));
  return this;
}

Assistant:

OmegaSN *slopeSN(std::vector<double> data, std::vector<double> states,
                    unsigned int nbSegments, std::string constraint = "null")
{
  OmegaSN *omega = new OmegaSN(states, data[0], nbSegments, data.size());
  //DIFFERENT CONSTRAINTS
  if(constraint == "null"){omega->algoNULL(data);}
  if(constraint == "isotonic"){omega->algoISOTONIC(data);}

  omega->backtracking(data.size());

  return omega;
}